

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::PolyOffsetBuilder::AddPoint(PolyOffsetBuilder *this,IntPoint *pt)

{
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *this_00;
  pointer pIVar1;
  vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *this_01;
  iterator __position;
  long64 lVar2;
  
  this_00 = this->m_curr_poly;
  pIVar1 = (this_00->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar1 == (this_00->
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
              (this_00,((long)pIVar1 -
                        (long)(this_00->
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 4) + 0x80);
  }
  this_01 = (vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)this->m_curr_poly;
  __position._M_current = *(IntPoint **)(this_01 + 8);
  if (__position._M_current != *(IntPoint **)(this_01 + 0x10)) {
    lVar2 = pt->Y;
    (__position._M_current)->X = pt->X;
    (__position._M_current)->Y = lVar2;
    *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x10;
    return;
  }
  std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
  _M_realloc_insert<ClipperLib::IntPoint_const&>(this_01,__position,pt);
  return;
}

Assistant:

void AddPoint(const IntPoint& pt)
{
    Polygon::size_type len = m_curr_poly->size();
    if (len == m_curr_poly->capacity())
        m_curr_poly->reserve(len + buffLength);
    m_curr_poly->push_back(pt);
}